

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbd.h
# Opt level: O1

void embree::collide2::updatePositions(ClothModel *model,float h)

{
  pointer pVVar1;
  pointer pVVar2;
  char cVar3;
  int iVar4;
  task *ptVar5;
  runtime_error *this;
  small_object_allocator alloc;
  task_group_context context;
  small_object_pool *local_d8;
  float local_cc;
  ClothModel *local_c8;
  float *local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  wait_context local_a8;
  task_group_context local_98;
  
  local_c0 = &local_cc;
  pVVar1 = (model->super_Mesh).x_.
           super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar2 = (model->super_Mesh).x_.
           super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_98.my_version = proxy_support;
  local_98.my_traits = (context_traits)0x4;
  local_98.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_98.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_98.my_name = CUSTOM_CTX;
  local_cc = h;
  local_c8 = model;
  tbb::detail::r1::initialize(&local_98);
  if (pVVar1 != pVVar2) {
    local_d8 = (small_object_pool *)0x0;
    ptVar5 = (task *)tbb::detail::r1::allocate(&local_d8,0x80);
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->m_reserved[5] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_002cec70;
    ptVar5[1]._vptr_task = (_func_int **)((long)pVVar1 - (long)pVVar2 >> 4);
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)&local_c8;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)(ptVar5[1].m_reserved + 4) = 0;
    *(undefined1 *)((long)ptVar5[1].m_reserved + 0x24) = 5;
    ptVar5[1].m_reserved[3] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
    ptVar5[1].m_reserved[5] = (uint64_t)local_d8;
    local_b8 = 0;
    local_b0 = 1;
    local_a8.m_version_and_traits = 1;
    local_a8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar5[1].m_reserved[2] = (uint64_t)&local_b8;
    tbb::detail::r1::execute_and_wait(ptVar5,&local_98,&local_a8,&local_98);
  }
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_98);
  if (cVar3 == '\0') {
    tbb::detail::r1::destroy(&local_98);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"task cancelled");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void updatePositions (ClothModel & model, float h) {

    parallel_for ((size_t)0, model.x_.size (), [&] (const range<size_t>& r) {
        for (size_t i=r.begin(); i<r.end(); i++) {

            model.x_last_[i].x = model.x_old_[i].x;
            model.x_last_[i].y = model.x_old_[i].y;
            model.x_last_[i].z = model.x_old_[i].z;

            model.x_old_[i].x = model.x_[i].x;
            model.x_old_[i].y = model.x_[i].y;
            model.x_old_[i].z = model.x_[i].z;

            model.v_[i].x += model.a_[i].x * h;
            model.v_[i].y += model.a_[i].y * h;
            model.v_[i].z += model.a_[i].z * h;

            model.x_[i].x += model.v_[i].x * h;
            model.x_[i].y += model.v_[i].y * h;
            model.x_[i].z += model.v_[i].z * h;
        }
    });
}